

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,MessageLite *prototype)

{
  byte in_CL;
  FieldType in_DL;
  undefined8 in_RDI;
  byte in_R8B;
  EnumValidityFuncWithArg *in_R9;
  MessageLite *unaff_retaddr;
  ExtensionInfo in_stack_00000010;
  ExtensionInfo info;
  LogMessage *in_stack_ffffffffffffff18;
  LogMessage *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  LogMessage *in_stack_ffffffffffffff30;
  ExtensionInfo local_88;
  byte local_51;
  EnumValidityFuncWithArg *local_18;
  byte local_f;
  byte local_e;
  FieldType local_d;
  int number_00;
  
  number_00 = (int)((ulong)in_RDI >> 0x20);
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_51 = 0;
  local_18 = in_R9;
  local_d = in_DL;
  if ((in_DL != '\v') && (in_DL != '\n')) {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff30,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (char *)in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_51 = 1;
    LogMessage::operator<<(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x469761);
  }
  ExtensionInfo::ExtensionInfo(&local_88,local_d,(bool)(local_e & 1),(bool)(local_f & 1));
  local_88.field_3.enum_validity_check.func = local_18;
  anon_unknown_19::Register(unaff_retaddr,number_00,in_stack_00000010);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* containing_type,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.message_info = {prototype};
  Register(containing_type, number, info);
}